

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Parser
coda_XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  XML_Bool XVar1;
  XML_ParamEntityParsing XVar2;
  DTD *oldDtd_00;
  NAMED **ppNVar3;
  XML_EndElementHandler p_Var4;
  XML_CharacterDataHandler p_Var5;
  XML_ProcessingInstructionHandler p_Var6;
  XML_Memory_Handling_Suite *pXVar7;
  BLOCK *pBVar8;
  BLOCK *pBVar9;
  XML_DefaultHandler p_Var10;
  XML_Memory_Handling_Suite *pXVar11;
  BLOCK *pBVar12;
  BLOCK *pBVar13;
  XML_EndNamespaceDeclHandler p_Var14;
  XML_NotStandaloneHandler p_Var15;
  XML_ExternalEntityRefHandler p_Var16;
  XML_SkippedEntityHandler p_Var17;
  NAMED **ppNVar18;
  XML_ElementDeclHandler p_Var19;
  XML_AttlistDeclHandler p_Var20;
  XML_EntityDeclHandler p_Var21;
  XML_Memory_Handling_Suite *pXVar22;
  ELEMENT_TYPE *pEVar23;
  NAMED **ppNVar24;
  NAMED **ppNVar25;
  XML_Parser pXVar26;
  XML_Bool XVar27;
  int iVar28;
  XML_Char local_123 [3];
  XML_Char tmp [2];
  BLOCK *pBStack_120;
  XML_Bool oldReparseDeferralEnabled;
  unsigned_long oldhash_secret_salt;
  XML_Bool oldns_triplets;
  int oldInEntityValue;
  XML_ParamEntityParsing oldParamEntityParsing;
  XML_Parser oldExternalEntityRefHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  void *oldHandlerArg;
  void *oldUserData;
  ELEMENT_TYPE *oldDeclElementType;
  XML_XmlDeclHandler oldXmlDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_StartElementHandler oldStartElementHandler;
  DTD *oldDtd;
  DTD *newDtd;
  XML_Parser parser;
  XML_Char *encodingName_local;
  XML_Char *context_local;
  XML_Parser oldParser_local;
  
  oldDtd = (DTD *)0x0;
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  oldDtd_00 = oldParser->m_dtd;
  ppNVar3 = (NAMED **)oldParser->m_startElementHandler;
  p_Var4 = oldParser->m_endElementHandler;
  p_Var5 = oldParser->m_characterDataHandler;
  p_Var6 = oldParser->m_processingInstructionHandler;
  pXVar7 = (XML_Memory_Handling_Suite *)oldParser->m_commentHandler;
  pBVar8 = (BLOCK *)oldParser->m_startCdataSectionHandler;
  pBVar9 = (BLOCK *)oldParser->m_endCdataSectionHandler;
  p_Var10 = oldParser->m_defaultHandler;
  pXVar11 = (XML_Memory_Handling_Suite *)oldParser->m_unparsedEntityDeclHandler;
  pBVar12 = (BLOCK *)oldParser->m_notationDeclHandler;
  pBVar13 = (BLOCK *)oldParser->m_startNamespaceDeclHandler;
  p_Var14 = oldParser->m_endNamespaceDeclHandler;
  p_Var15 = oldParser->m_notStandaloneHandler;
  p_Var16 = oldParser->m_externalEntityRefHandler;
  p_Var17 = oldParser->m_skippedEntityHandler;
  ppNVar18 = (NAMED **)oldParser->m_unknownEncodingHandler;
  p_Var19 = oldParser->m_elementDeclHandler;
  p_Var20 = oldParser->m_attlistDeclHandler;
  p_Var21 = oldParser->m_entityDeclHandler;
  pXVar22 = (XML_Memory_Handling_Suite *)oldParser->m_xmlDeclHandler;
  pEVar23 = oldParser->m_declElementType;
  ppNVar24 = (NAMED **)oldParser->m_userData;
  ppNVar25 = (NAMED **)oldParser->m_handlerArg;
  XVar27 = oldParser->m_defaultExpandInternalEntities;
  pXVar26 = oldParser->m_externalEntityRefHandlerArg;
  XVar2 = oldParser->m_paramEntityParsing;
  iVar28 = (oldParser->m_prologState).inEntityValue;
  XVar1 = oldParser->m_ns_triplets;
  pBStack_120 = (BLOCK *)oldParser->m_hash_secret_salt;
  local_123[2] = oldParser->m_reparseDeferralEnabled;
  if (context == (XML_Char *)0x0) {
    oldDtd = oldDtd_00;
  }
  if (oldParser->m_ns == '\0') {
    newDtd = (DTD *)parserCreate(encodingName,&oldParser->m_mem,(XML_Char *)0x0,oldDtd);
  }
  else {
    local_123[0] = oldParser->m_namespaceSeparator;
    local_123[1] = 0;
    newDtd = (DTD *)parserCreate(encodingName,&oldParser->m_mem,local_123,oldDtd);
  }
  if (newDtd != (DTD *)0x0) {
    (newDtd->prefixes).v = ppNVar3;
    *(XML_EndElementHandler *)&(newDtd->prefixes).power = p_Var4;
    (newDtd->prefixes).size = (size_t)p_Var5;
    (newDtd->prefixes).used = (size_t)p_Var6;
    (newDtd->prefixes).mem = pXVar7;
    (newDtd->pool).blocks = pBVar8;
    (newDtd->pool).freeBlocks = pBVar9;
    (newDtd->pool).end = (XML_Char *)p_Var10;
    (newDtd->pool).mem = pXVar11;
    (newDtd->entityValuePool).blocks = pBVar12;
    (newDtd->entityValuePool).freeBlocks = pBVar13;
    (newDtd->entityValuePool).end = (XML_Char *)p_Var14;
    (newDtd->entityValuePool).ptr = (XML_Char *)p_Var15;
    (newDtd->entityValuePool).start = (XML_Char *)p_Var16;
    *(XML_SkippedEntityHandler *)&newDtd->keepProcessing = p_Var17;
    (newDtd->paramEntities).v = ppNVar18;
    *(XML_ElementDeclHandler *)&(newDtd->paramEntities).power = p_Var19;
    (newDtd->paramEntities).size = (size_t)p_Var20;
    (newDtd->paramEntities).used = (size_t)p_Var21;
    (newDtd->paramEntities).mem = pXVar22;
    newDtd[1].defaultPrefix.name = (XML_Char *)pEVar23;
    (newDtd->generalEntities).v = ppNVar24;
    if (ppNVar24 == ppNVar25) {
      *(NAMED ***)&(newDtd->generalEntities).power = (newDtd->generalEntities).v;
    }
    else {
      *(DTD **)&(newDtd->generalEntities).power = newDtd;
    }
    if (pXVar26 != oldParser) {
      (newDtd->entityValuePool).mem = (XML_Memory_Handling_Suite *)pXVar26;
    }
    *(XML_Bool *)&newDtd[1].entityValuePool.start = XVar27;
    *(XML_Bool *)((long)&newDtd[1].attributeIds.mem + 1) = XVar1;
    newDtd[2].entityValuePool.freeBlocks = pBStack_120;
    *(XML_Char *)&(newDtd->attributeIds).size = local_123[2];
    newDtd[2].pool.start = (XML_Char *)oldParser;
    *(XML_ParamEntityParsing *)((long)&newDtd[2].entityValuePool.blocks + 4) = XVar2;
    *(int *)&newDtd[1].pool.end = iVar28;
    if (context == (XML_Char *)0x0) {
      *(undefined1 *)&newDtd[2].entityValuePool.blocks = 1;
      coda_XmlPrologStateInitExternalEntity((PROLOG_STATE *)&newDtd[1].prefixes.mem);
      newDtd[1].pool.ptr = (XML_Char *)externalParEntInitProcessor;
    }
    else {
      iVar28 = dtdCopy(oldParser,(DTD *)newDtd[1].scaffold,oldDtd_00,
                       (XML_Memory_Handling_Suite *)&(newDtd->generalEntities).used);
      if ((iVar28 == 0) || (XVar27 = setContext((XML_Parser)newDtd,context), XVar27 == '\0')) {
        coda_XML_ParserFree((XML_Parser)newDtd);
        return (XML_Parser)0x0;
      }
      newDtd[1].pool.ptr = (XML_Char *)externalEntityInitProcessor;
    }
    return (XML_Parser)newDtd;
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser, const XML_Char *context,
                               const XML_Char *encodingName) {
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE *oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;
  XML_Bool oldReparseDeferralEnabled;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;
  oldReparseDeferralEnabled = parser->m_reparseDeferralEnabled;

#ifdef XML_DTD
  if (! context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2] = {parser->m_namespaceSeparator, 0};
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  } else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (! parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_reparseDeferralEnabled = oldReparseDeferralEnabled;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (! dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
        || ! setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  } else {
    /* The DTD instance referenced by parser->m_dtd is shared between the
       document's root parser and external PE parsers, therefore one does not
       need to call setContext. In addition, one also *must* not call
       setContext, because this would overwrite existing prefix->binding
       pointers in parser->m_dtd with ones that get destroyed with the external
       PE parser. This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}